

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_to_hex.hpp
# Opt level: O2

char * mserialize::detail::write_integer_as_hex<unsigned_short>(unsigned_short v,char *end)

{
  undefined6 in_register_0000003a;
  ulong uVar1;
  
  uVar1 = CONCAT62(in_register_0000003a,v);
  if ((int)uVar1 == 0) {
    end[-1] = '0';
    end = end + -1;
  }
  else {
    for (; (short)uVar1 != 0; uVar1 = (uVar1 & 0xffff) >> 4) {
      end[-1] = "0123456789ABCDEF"[(uint)(uVar1 & 0xffff) & 0xf];
      end = end + -1;
    }
  }
  return end;
}

Assistant:

constexpr char* write_integer_as_hex(Integer v, char* end)
{
  const char digits[] = "0123456789ABCDEF";

  if (v == 0)
  {
    *--end = '0';
  }
  else if (v > 0)
  {
    while (v != 0)
    {
      *--end = digits[v % 16];
      v = static_cast<Integer>(v / 16);
    }
  }
  else
  {
    while (v != 0)
    {
      *--end = digits[-(v % 16)];
      v = static_cast<Integer>(v / 16);
    }
    *--end = '-';
  }

  return end;
}